

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

Statement *
slang::ast::WaitOrderStatement::fromSyntax
          (Compilation *compilation,WaitOrderStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  bool bVar1;
  int iVar2;
  Expression *pEVar3;
  undefined4 extraout_var;
  Type *this;
  ActionBlockSyntax *pAVar4;
  undefined4 extraout_var_00;
  SyntaxNode *this_00;
  StatementSyntax *pSVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  const_iterator cVar6;
  SourceRange sourceRange;
  bool local_239;
  bitmask<slang::ast::ASTFlags> local_128;
  bitmask<slang::ast::ASTFlags> local_120;
  SourceRange local_118;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_108;
  Compilation *local_f8;
  WaitOrderStatement *result;
  Statement *ifFalse;
  Statement *ifTrue;
  SourceRange local_d8;
  DiagCode local_c8;
  undefined4 local_c4;
  bitmask<slang::ast::ASTFlags> local_c0;
  Expression *local_b8;
  Expression *ev;
  NameSyntax *name;
  const_iterator __end2;
  undefined1 local_88 [8];
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *__range2;
  SmallVector<const_slang::ast::Expression_*,_5UL> events;
  StatementContext *stmtCtx_local;
  ASTContext *context_local;
  WaitOrderStatementSyntax *syntax_local;
  Compilation *compilation_local;
  
  events.stackBase._24_8_ = stmtCtx;
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)&__range2);
  __begin2.index = (size_t)&syntax->names;
  cVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::begin
                    ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)__begin2.index);
  __begin2.list = (ParentList *)cVar6.index;
  local_88 = (undefined1  [8])cVar6.list;
  cVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::end
                    ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)__begin2.index);
  do {
    __end2.list = (ParentList *)cVar6.index;
    name = (NameSyntax *)cVar6.list;
    bVar1 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::NameSyntax_*,_unsigned_long,_const_slang::syntax::NameSyntax_**,_const_slang::syntax::NameSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::NameSyntax_*,_unsigned_long,_const_slang::syntax::NameSyntax_**,_const_slang::syntax::NameSyntax_*&>
                          *)local_88,(iterator_base<const_slang::syntax::NameSyntax_*> *)&name);
    if (!bVar1) {
      ifFalse = (Statement *)0x0;
      result = (WaitOrderStatement *)0x0;
      pAVar4 = not_null<slang::syntax::ActionBlockSyntax_*>::operator->(&syntax->action);
      if (pAVar4->statement != (StatementSyntax *)0x0) {
        pAVar4 = not_null<slang::syntax::ActionBlockSyntax_*>::operator->(&syntax->action);
        iVar2 = Statement::bind((int)pAVar4->statement,(sockaddr *)context,events.stackBase._24_4_);
        ifFalse = (Statement *)CONCAT44(extraout_var_00,iVar2);
      }
      pAVar4 = not_null<slang::syntax::ActionBlockSyntax_*>::operator->(&syntax->action);
      src = extraout_RDX;
      if (pAVar4->elseClause != (ElseClauseSyntax *)0x0) {
        pAVar4 = not_null<slang::syntax::ActionBlockSyntax_*>::operator->(&syntax->action);
        this_00 = not_null<slang::syntax::SyntaxNode_*>::operator->(&pAVar4->elseClause->clause);
        pSVar5 = slang::syntax::SyntaxNode::as<slang::syntax::StatementSyntax>(this_00);
        iVar2 = Statement::bind((int)pSVar5,(sockaddr *)context,events.stackBase._24_4_);
        result = (WaitOrderStatement *)CONCAT44(extraout_var_01,iVar2);
        src = extraout_RDX_00;
      }
      iVar2 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                        ((SmallVectorBase<const_slang::ast::Expression_*> *)&__range2,
                         (EVP_PKEY_CTX *)compilation,src);
      local_108.data_ = (pointer)CONCAT44(extraout_var_02,iVar2);
      local_118 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      local_f8 = (Compilation *)
                 BumpAllocator::
                 emplace<slang::ast::WaitOrderStatement,nonstd::span_lite::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Statement_const*&,slang::ast::Statement_const*&,slang::SourceRange>
                           (&compilation->super_BumpAllocator,&local_108,&ifFalse,
                            (Statement **)&result,&local_118);
      bitmask<slang::ast::ASTFlags>::bitmask(&local_120,Function);
      bVar1 = bitmask<slang::ast::ASTFlags>::has(&context->flags,&local_120);
      local_239 = true;
      if (!bVar1) {
        bitmask<slang::ast::ASTFlags>::bitmask(&local_128,Final);
        bVar1 = bitmask<slang::ast::ASTFlags>::has(&context->flags,&local_128);
        local_239 = true;
        if (!bVar1) {
          local_239 = ASTContext::inAlwaysCombLatch(context);
        }
      }
      if (local_239 == false) {
        compilation_local = local_f8;
      }
      else {
        sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        ASTContext::addDiag(context,(DiagCode)0x460008,sourceRange);
        compilation_local = (Compilation *)Statement::badStmt(compilation,(Statement *)local_f8);
      }
LAB_0044f8c8:
      local_c4 = 1;
      SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::Expression_*,_5UL> *)&__range2);
      return (Statement *)compilation_local;
    }
    pEVar3 = (Expression *)
             slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::
             iterator_base<const_slang::syntax::NameSyntax_*>::operator*
                       ((iterator_base<const_slang::syntax::NameSyntax_*> *)local_88);
    ev = pEVar3;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_c0,None);
    iVar2 = Expression::bind((int)pEVar3,(sockaddr *)context,(socklen_t)local_c0.m_bits);
    local_b8 = (Expression *)CONCAT44(extraout_var,iVar2);
    bVar1 = Expression::bad(local_b8);
    if (bVar1) {
      compilation_local = (Compilation *)Statement::badStmt(compilation,(Statement *)0x0);
      goto LAB_0044f8c8;
    }
    this = not_null<const_slang::ast::Type_*>::operator->(&local_b8->type);
    bVar1 = Type::isEvent(this);
    if (!bVar1) {
      local_c8.subsystem = Statements;
      local_c8.code = 0x2c;
      local_d8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)ev);
      ASTContext::addDiag(context,local_c8,local_d8);
      compilation_local = (Compilation *)Statement::badStmt(compilation,(Statement *)0x0);
      goto LAB_0044f8c8;
    }
    ifTrue = (Statement *)local_b8;
    SmallVectorBase<const_slang::ast::Expression_*>::push_back
              ((SmallVectorBase<const_slang::ast::Expression_*> *)&__range2,(Expression **)&ifTrue);
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::NameSyntax_*,_unsigned_long,_const_slang::syntax::NameSyntax_**,_const_slang::syntax::NameSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::NameSyntax_*,_unsigned_long,_const_slang::syntax::NameSyntax_**,_const_slang::syntax::NameSyntax_*&>
                  *)local_88);
    cVar6.index = (size_t)__end2.list;
    cVar6.list = (ParentList *)name;
  } while( true );
}

Assistant:

Statement& WaitOrderStatement::fromSyntax(Compilation& compilation,
                                          const WaitOrderStatementSyntax& syntax,
                                          const ASTContext& context, StatementContext& stmtCtx) {
    SmallVector<const Expression*> events;
    for (auto name : syntax.names) {
        auto& ev = Expression::bind(*name, context);
        if (ev.bad())
            return badStmt(compilation, nullptr);

        if (!ev.type->isEvent()) {
            context.addDiag(diag::NotAnEvent, name->sourceRange());
            return badStmt(compilation, nullptr);
        }

        events.push_back(&ev);
    }

    const Statement* ifTrue = nullptr;
    const Statement* ifFalse = nullptr;
    if (syntax.action->statement)
        ifTrue = &Statement::bind(*syntax.action->statement, context, stmtCtx);

    if (syntax.action->elseClause) {
        ifFalse = &Statement::bind(syntax.action->elseClause->clause->as<StatementSyntax>(),
                                   context, stmtCtx);
    }

    auto result = compilation.emplace<WaitOrderStatement>(events.copy(compilation), ifTrue, ifFalse,
                                                          syntax.sourceRange());
    if (context.flags.has(ASTFlags::Function) || context.flags.has(ASTFlags::Final) ||
        context.inAlwaysCombLatch()) {
        context.addDiag(diag::TimingInFuncNotAllowed, syntax.sourceRange());
        return badStmt(compilation, result);
    }

    return *result;
}